

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_n_helpers.hpp
# Opt level: O1

void duckdb::MinMaxNOperation::
     Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::MinMaxFixedValue<int>,duckdb::GreaterThan>>
               (Vector *state_vector,AggregateInputData *param_2,Vector *result,idx_t count,
               idx_t offset)

{
  ulong uVar1;
  ulong *puVar2;
  long lVar3;
  data_ptr_t pdVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar5;
  _Iter_comp_iter<bool_(*)(const_std::pair<duckdb::HeapEntry<int>,_duckdb::HeapEntry<long>_>_&,_const_std::pair<duckdb::HeapEntry<int>,_duckdb::HeapEntry<long>_>_&)>
  _Var6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  undefined8 *puVar8;
  TemplatedValidityData<unsigned_long> *pTVar9;
  idx_t iVar10;
  idx_t iVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  UnifiedVectorFormat state_format;
  idx_t local_c0;
  _Iter_comp_iter<bool_(*)(const_std::pair<duckdb::HeapEntry<int>,_duckdb::HeapEntry<long>_>_&,_const_std::pair<duckdb::HeapEntry<int>,_duckdb::HeapEntry<long>_>_&)>
  local_b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_b0;
  Vector *local_a0;
  buffer_ptr<ValidityBuffer> *local_98;
  data_ptr_t local_90;
  idx_t local_88;
  idx_t local_80;
  UnifiedVectorFormat local_78;
  
  local_88 = offset;
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  Vector::ToUnifiedFormat(state_vector,count,&local_78);
  FlatVector::VerifyFlatVector(result);
  local_c0 = ListVector::GetListSize(result);
  if (count == 0) {
    lVar13 = 0;
  }
  else {
    lVar13 = 0;
    iVar10 = 0;
    do {
      iVar11 = iVar10;
      if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
        iVar11 = (idx_t)(local_78.sel)->sel_vector[iVar10];
      }
      lVar13 = lVar13 + *(long *)(*(long *)(local_78.data + iVar11 * 8) + 0x10);
      iVar10 = iVar10 + 1;
    } while (count != iVar10);
  }
  ListVector::Reserve(result,lVar13 + local_c0);
  local_90 = result->data;
  local_a0 = ListVector::GetEntry(result);
  if (count != 0) {
    local_98 = &(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
    uVar14 = 0;
    do {
      uVar12 = uVar14;
      if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
        uVar12 = (ulong)(local_78.sel)->sel_vector[uVar14];
      }
      uVar1 = uVar14 + local_88;
      lVar13 = *(long *)(local_78.data + uVar12 * 8);
      if ((*(char *)(lVar13 + 0x18) == '\x01') && (lVar3 = *(long *)(lVar13 + 0x10), lVar3 != 0)) {
        *(idx_t *)(local_90 + uVar1 * 0x10) = local_c0;
        *(long *)(local_90 + uVar1 * 0x10 + 8) = lVar3;
        local_b8._M_comp = BinaryAggregateHeap<int,_long,_duckdb::GreaterThan>::Compare;
        ::std::
        __sort_heap<std::pair<duckdb::HeapEntry<int>,duckdb::HeapEntry<long>>*,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<duckdb::HeapEntry<int>,duckdb::HeapEntry<long>>const&,std::pair<duckdb::HeapEntry<int>,duckdb::HeapEntry<long>>const&)>>
                  (*(pair<duckdb::HeapEntry<int>,_duckdb::HeapEntry<long>_> **)(lVar13 + 8),
                   *(pair<duckdb::HeapEntry<int>,_duckdb::HeapEntry<long>_> **)(lVar13 + 8) + lVar3,
                   &local_b8);
        if (*(long *)(lVar13 + 0x10) != 0) {
          puVar8 = (undefined8 *)(*(long *)(lVar13 + 8) + 8);
          pdVar4 = local_a0->data;
          uVar12 = 0;
          do {
            *(undefined8 *)(pdVar4 + uVar12 * 8 + local_c0 * 8) = *puVar8;
            uVar12 = uVar12 + 1;
            puVar8 = puVar8 + 2;
          } while (uVar12 < *(ulong *)(lVar13 + 0x10));
          local_c0 = local_c0 + uVar12;
        }
      }
      else {
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          local_80 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_b8,&local_80);
          p_Var7 = p_Stack_b0;
          _Var6._M_comp = local_b8._M_comp;
          local_b8._M_comp =
               (_func_bool_pair<duckdb::HeapEntry<int>,_duckdb::HeapEntry<long>_>_ptr_pair<duckdb::HeapEntry<int>,_duckdb::HeapEntry<long>_>_ptr
                *)0x0;
          p_Stack_b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)_Var6._M_comp;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var7;
          if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
          }
          if (p_Stack_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_b0);
          }
          pTVar9 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                             (local_98);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)
               (pTVar9->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
        }
        bVar5 = (byte)uVar1 & 0x3f;
        puVar2 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                 (uVar1 >> 6);
        *puVar2 = *puVar2 & (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != count);
  }
  ListVector::SetListSize(result,local_c0);
  Vector::Verify(result,count);
  if (local_78.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void Finalize(Vector &state_vector, AggregateInputData &, Vector &result, idx_t count, idx_t offset) {

		UnifiedVectorFormat state_format;
		state_vector.ToUnifiedFormat(count, state_format);

		const auto states = UnifiedVectorFormat::GetData<STATE *>(state_format);
		auto &mask = FlatVector::Validity(result);

		const auto old_len = ListVector::GetListSize(result);

		// Count the number of new entries
		idx_t new_entries = 0;
		for (idx_t i = 0; i < count; i++) {
			const auto state_idx = state_format.sel->get_index(i);
			auto &state = *states[state_idx];
			new_entries += state.heap.Size();
		}

		// Resize the list vector to fit the new entries
		ListVector::Reserve(result, old_len + new_entries);

		const auto list_entries = FlatVector::GetData<list_entry_t>(result);
		auto &child_data = ListVector::GetEntry(result);

		idx_t current_offset = old_len;
		for (idx_t i = 0; i < count; i++) {
			const auto rid = i + offset;
			const auto state_idx = state_format.sel->get_index(i);
			auto &state = *states[state_idx];

			if (!state.is_initialized || state.heap.IsEmpty()) {
				mask.SetInvalid(rid);
				continue;
			}

			// Add the entries to the list vector
			auto &list_entry = list_entries[rid];
			list_entry.offset = current_offset;
			list_entry.length = state.heap.Size();

			// Turn the heap into a sorted list, invalidating the heap property
			auto heap = state.heap.SortAndGetHeap();

			for (idx_t slot = 0; slot < state.heap.Size(); slot++) {
				STATE::VAL_TYPE::Assign(child_data, current_offset++, state.heap.GetValue(heap[slot]));
			}
		}

		D_ASSERT(current_offset == old_len + new_entries);
		ListVector::SetListSize(result, current_offset);
		result.Verify(count);
	}